

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void change_direction_move(Direction *direction,char input_direction)

{
  char input_direction_local;
  Direction *direction_local;
  
  if ((input_direction == 'A') || (input_direction == 'w')) {
    *direction = UP;
  }
  if ((input_direction == 'B') || (input_direction == 's')) {
    *direction = DOWN;
  }
  if ((input_direction == 'D') || (input_direction == 'a')) {
    *direction = LEFT;
  }
  if ((input_direction == 'C') || (input_direction == 'd')) {
    *direction = RIGHT;
  }
  return;
}

Assistant:

void change_direction_move(Direction& direction, char input_direction)
{
    if(input_direction == KEY_UP or input_direction == 'w')
        direction = UP;

    if(input_direction == KEY_DOWN or input_direction == 's')
        direction = DOWN;

    if(input_direction == KEY_LEFT or input_direction == 'a')
        direction = LEFT;

    if(input_direction == KEY_RIGHT or input_direction == 'd')
        direction = RIGHT;
}